

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void send_handle_and_close(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in addr;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,&tcp_server);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&tcp_server,&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
        if (iVar1 == 0) {
          uv_close(&tcp_server,0);
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0x361;
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x359;
      }
    }
    else {
      pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
      uVar2 = 0x356;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x354;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void send_handle_and_close() {
  int r;
  struct sockaddr_in addr;

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_write2(&write_req,
                (uv_stream_t*)&channel,
                &large_buf,
                1,
                (uv_stream_t*)&tcp_server,
                closed_handle_write_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&tcp_server, NULL);
}